

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

void HighsHashTree<int,void>::mergeIntoLeaf<3,1>
               (InnerLeaf<3> *leaf,InnerLeaf<1> *mergeLeaf,int hashPos)

{
  ulong uVar1;
  array<HighsHashTableEntry<int,_void>,_6UL> *entry;
  long lVar2;
  
  if (0 < mergeLeaf->size) {
    entry = &mergeLeaf->entries;
    lVar2 = 0;
    do {
      uVar1 = (ulong)(uint)entry->_M_elems[0].value_;
      HighsHashTree<int,_void>::InnerLeaf<3>::insert_entry
                (leaf,uVar1 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
                      uVar1 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,hashPos,entry->_M_elems);
      lVar2 = lVar2 + 1;
      entry = (array<HighsHashTableEntry<int,_void>,_6UL> *)(entry->_M_elems + 1);
    } while (lVar2 < mergeLeaf->size);
  }
  return;
}

Assistant:

static void mergeIntoLeaf(InnerLeaf<SizeClass1>* leaf,
                            InnerLeaf<SizeClass2>* mergeLeaf, int hashPos) {
    for (int i = 0; i < mergeLeaf->size; ++i)
      leaf->insert_entry(compute_hash(mergeLeaf->entries[i].key()), hashPos,
                         mergeLeaf->entries[i]);
  }